

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O0

duckdb_value
duckdb_create_union_value(duckdb_logical_type union_type,idx_t tag_index,duckdb_value value)

{
  LogicalTypeId LVar1;
  bool bVar2;
  uchar uVar3;
  LogicalType *this;
  idx_t iVar4;
  Value *value_00;
  Value *pVVar5;
  duckdb_value in_RDX;
  ulong in_RSI;
  duckdb_logical_type in_RDI;
  Value *union_value;
  child_list_t<LogicalType> member_types;
  Value *unwrapped_value;
  LogicalType *member_type;
  idx_t member_count;
  LogicalType *union_logical_type;
  Value *in_stack_fffffffffffffea8;
  Value *in_stack_fffffffffffffeb0;
  Value *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  LogicalType *in_stack_fffffffffffffee8;
  uint8_t tag;
  undefined8 local_8;
  
  if ((in_RDI == (duckdb_logical_type)0x0) || (in_RDX == (duckdb_value)0x0)) {
    local_8 = (duckdb_value)0x0;
  }
  else {
    this = UnwrapType(in_RDI);
    LVar1 = duckdb::LogicalType::id(this);
    if (LVar1 == UNION) {
      iVar4 = duckdb::UnionType::GetMemberCount((LogicalType *)0x1910a1a);
      if (in_RSI < iVar4) {
        value_00 = (Value *)duckdb::UnionType::GetMemberType
                                      (&in_stack_fffffffffffffeb0->type_,
                                       (idx_t)in_stack_fffffffffffffea8);
        tag = (uint8_t)(iVar4 >> 0x38);
        pVVar5 = UnwrapValue(in_RDX);
        duckdb::Value::type(pVVar5);
        bVar2 = duckdb::LogicalType::operator!=
                          (&in_stack_fffffffffffffeb0->type_,&in_stack_fffffffffffffea8->type_);
        if (bVar2) {
          local_8 = (duckdb_value)0x0;
        }
        else {
          duckdb::UnionType::CopyMemberTypes_abi_cxx11_(in_stack_fffffffffffffee8);
          pVVar5 = (Value *)operator_new(0x40);
          duckdb::LogicalType::LogicalType
                    ((LogicalType *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     (LogicalTypeId)((ulong)pVVar5 >> 0x38));
          duckdb::Value::Value
                    ((Value *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
                     &in_stack_fffffffffffffeb8->type_);
          duckdb::LogicalType::~LogicalType((LogicalType *)0x1910b16);
          duckdb::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    *)in_stack_fffffffffffffeb0,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    *)in_stack_fffffffffffffea8);
          uVar3 = duckdb::NumericCast<unsigned_char,unsigned_long,void>(0x1910b44);
          duckdb::Value::Value
                    ((Value *)CONCAT17(uVar3,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8);
          duckdb::Value::UNION((child_list_t<LogicalType> *)this,tag,value_00);
          duckdb::Value::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          duckdb::Value::~Value(in_stack_fffffffffffffeb0);
          duckdb::Value::~Value(in_stack_fffffffffffffeb0);
          duckdb::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     *)0x1910bb4);
          local_8 = WrapValue(pVVar5);
          duckdb::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     *)0x1910cff);
        }
      }
      else {
        local_8 = (duckdb_value)0x0;
      }
    }
    else {
      local_8 = (duckdb_value)0x0;
    }
  }
  return local_8;
}

Assistant:

duckdb_value duckdb_create_union_value(duckdb_logical_type union_type, idx_t tag_index, duckdb_value value) {
	if (!union_type || !value) {
		return nullptr;
	}
	const auto &union_logical_type = UnwrapType(union_type);
	if (union_logical_type.id() != duckdb::LogicalTypeId::UNION) {
		return nullptr;
	}
	idx_t member_count = duckdb::UnionType::GetMemberCount(union_logical_type);
	if (tag_index >= member_count) {
		return nullptr;
	}
	const auto &member_type = duckdb::UnionType::GetMemberType(union_logical_type, tag_index);
	const auto &unwrapped_value = UnwrapValue(value);
	if (unwrapped_value.type() != member_type) {
		return nullptr;
	}
	const auto member_types = duckdb::UnionType::CopyMemberTypes(union_logical_type);
	duckdb::Value *union_value = new duckdb::Value;
	try {
		*union_value = duckdb::Value::UNION(member_types, duckdb::NumericCast<uint8_t>(tag_index), unwrapped_value);
	} catch (...) {
		delete union_value;
		return nullptr;
	}
	return WrapValue(union_value);
}